

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_map_all(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  CVmObject *pCVar2;
  CVmRun *pCVar3;
  vm_val_t *in_RDX;
  undefined4 in_ESI;
  CVmRun *in_RDI;
  vm_rcdesc rc;
  CVmObjVector *new_vec;
  size_t idx;
  vm_val_t *func_val;
  CVmNativeCodeDesc *in_stack_ffffffffffffff38;
  CVmObject *idx_00;
  CVmRun *in_stack_ffffffffffffff40;
  uint caller_ofs;
  vm_val_t *in_stack_ffffffffffffff48;
  CVmRun *recurse_ctx;
  vm_val_t *this_00;
  undefined4 in_stack_ffffffffffffff58;
  vm_val_t *in_stack_ffffffffffffff68;
  unsigned_short in_stack_ffffffffffffff72;
  vm_obj_id_t in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  vm_rcdesc *in_stack_ffffffffffffff80;
  CVmRun *local_38;
  
  if ((getp_map_all(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_map_all(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_map_all::desc,1);
    __cxa_guard_release(&getp_map_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  CVmStack::get(0);
  vm_rcdesc::vm_rcdesc
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
             in_stack_ffffffffffffff72,in_stack_ffffffffffffff68,(uint *)in_RDI);
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff48,(uint *)in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff38);
  if (iVar1 == 0) {
    CVmStack::get(0);
    CVmRun::push_obj(in_stack_ffffffffffffff40,
                     (vm_obj_id_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    this_00 = in_RDX;
    get_allocated_count((CVmObjVector *)0x3a0073);
    obj = create((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(size_t)in_stack_ffffffffffffff38);
    vm_val_t::set_obj(this_00,obj);
    pCVar2 = vm_objp(0);
    CVmStack::push(in_RDX);
    local_38 = (CVmRun *)0x0;
    while( true ) {
      caller_ofs = (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20);
      recurse_ctx = local_38;
      pCVar3 = (CVmRun *)get_element_count((CVmObjVector *)0x3a00d1);
      if (pCVar3 <= recurse_ctx) break;
      push_element((CVmObjVector *)this_00,(size_t)recurse_ctx);
      CVmRun::call_func_ptr
                (in_RDI,(vm_val_t *)CONCAT44(in_ESI,in_stack_ffffffffffffff58),
                 (uint)((ulong)this_00 >> 0x20),(vm_rcdesc *)recurse_ctx,caller_ofs);
      idx_00 = pCVar2;
      in_stack_ffffffffffffff40 = local_38;
      CVmRun::get_r0();
      set_element((CVmObjVector *)in_stack_ffffffffffffff40,(size_t)idx_00,(vm_val_t *)0x3a0144);
      set_element_count((CVmObjVector *)in_stack_ffffffffffffff40,(size_t)idx_00);
      local_38 = (CVmRun *)((long)&(local_38->super_CVmStack).arr_ + 1);
    }
    CVmStack::discard(3);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_map_all(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc)
{
    const vm_val_t *func_val;
    size_t idx;
    CVmObjVector *new_vec;
    static CVmNativeCodeDesc desc(1);
    vm_rcdesc rc(vmg_ "Vector.mapAll", self, 10, G_stk->get(0), argc);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while working to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* 
     *   allocate a new vector for the return value - the new vector will
     *   have the same size as the original, since we're mapping each
     *   element of the old vector to the corresponding element of the new
     *   vector 
     */
    retval->set_obj(create(vmg_ FALSE, get_allocated_count()));

    /* get the return value as an vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   push a reference to the new list to protect it from the garbage
     *   collector, which could be invoked in the course of executing the
     *   user callback 
     */
    G_stk->push(retval);

    /*
     *   Go through each element of our vector, and invoke the callback on
     *   each element, storing the result in the corresponding element of
     *   the new vector.  Note that we re-check the element count on each
     *   iteration, in case the callback changes it on us.  
     */
    for (idx = 0 ; idx < get_element_count() ; ++idx)
    {
        /* push the element as the callback's argument */
        push_element(vmg_ idx);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* 
         *   replace this element with the result (there's no need to save
         *   undo, since the whole vector is new) 
         */
        new_vec->set_element(idx, G_interpreter->get_r0());
        new_vec->set_element_count(idx + 1);
    }

    /* discard our gc protection (self, new vector) and our arguments */
    G_stk->discard(3);

    /* handled */
    return TRUE;
}